

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr TIFFReadDirEntryIfd8Array(TIFF *tif,TIFFDirEntry *direntry,uint64_t **value)

{
  uint16_t uVar1;
  ulong *puVar2;
  uint local_54;
  ulong *puStack_50;
  uint32_t n;
  uint64_t *mb;
  uint32_t *ma;
  uint64_t *data;
  void *origdata;
  uint32_t count;
  TIFFReadDirEntryErr err;
  uint64_t **value_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  uVar1 = direntry->tdir_type;
  if ((((uVar1 == 4) || (uVar1 == 0xd)) || (uVar1 == 0x10)) || (uVar1 == 0x12)) {
    _count = value;
    value_local = (uint64_t **)direntry;
    direntry_local = (TIFFDirEntry *)tif;
    origdata._4_4_ = TIFFReadDirEntryArray(tif,direntry,(uint32_t *)&origdata,8,&data);
    if ((origdata._4_4_ == TIFFReadDirEntryErrOk) && (data != (uint64_t *)0x0)) {
      if ((*(ushort *)((long)value_local + 2) | 2) == 0x12) {
        *_count = data;
        if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
          TIFFSwabArrayOfLong8(*_count,(ulong)(uint)origdata);
        }
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      else {
        puVar2 = (ulong *)_TIFFmallocExt((TIFF *)direntry_local,(ulong)((uint)origdata << 3));
        if (puVar2 == (ulong *)0x0) {
          _TIFFfreeExt((TIFF *)direntry_local,data);
          tif_local._4_4_ = TIFFReadDirEntryErrAlloc;
        }
        else {
          if ((*(short *)((long)value_local + 2) == 4) || (*(short *)((long)value_local + 2) == 0xd)
             ) {
            mb = data;
            puStack_50 = puVar2;
            for (local_54 = 0; local_54 < (uint)origdata; local_54 = local_54 + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)mb);
              }
              *puStack_50 = (ulong)(uint)*mb;
              puStack_50 = puStack_50 + 1;
              mb = (uint64_t *)((long)mb + 4);
            }
          }
          _TIFFfreeExt((TIFF *)direntry_local,data);
          *_count = puVar2;
          tif_local._4_4_ = TIFFReadDirEntryErrOk;
        }
      }
    }
    else {
      *_count = (uint64_t *)0x0;
      tif_local._4_4_ = origdata._4_4_;
    }
  }
  else {
    tif_local._4_4_ = TIFFReadDirEntryErrType;
  }
  return tif_local._4_4_;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryIfd8Array(TIFF *tif, TIFFDirEntry *direntry, uint64_t **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    uint64_t *data;
    switch (direntry->tdir_type)
    {
        case TIFF_LONG:
        case TIFF_LONG8:
        case TIFF_IFD:
        case TIFF_IFD8:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 8, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_LONG8:
        case TIFF_IFD8:
            *value = (uint64_t *)origdata;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong8(*value, count);
            return (TIFFReadDirEntryErrOk);
    }
    data = (uint64_t *)_TIFFmallocExt(tif, count * 8);
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_LONG:
        case TIFF_IFD:
        {
            uint32_t *ma;
            uint64_t *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                *mb++ = (uint64_t)(*ma++);
            }
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    *value = data;
    return (TIFFReadDirEntryErrOk);
}